

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullptr_tests.cpp
# Opt level: O0

void __thiscall
iu_NullTest_x_iutest_x_Null_Test::~iu_NullTest_x_iutest_x_Null_Test
          (iu_NullTest_x_iutest_x_Null_Test *this)

{
  iu_NullTest_x_iutest_x_Null_Test *this_local;
  
  ~iu_NullTest_x_iutest_x_Null_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(NullTest, Null)
{
    int* p = NULL;
    IUTEST_ASSERT_NULL(p);
    IUTEST_EXPECT_NULL(p);
    IUTEST_INFORM_NULL(p);

#if IUTEST_HAS_NULLPTR
    IUTEST_ASSERT_NULL(nullptr);
#else
    IUTEST_ASSERT_NULL(NULL);
#endif
}